

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

HANDLE OpenEventW(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName)

{
  CPalThread *pthr;
  PAL_ERROR palError;
  HANDLE hEvent;
  LPCWSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpName == (LPCWSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pthr._4_4_ = 0x57;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","OpenEventW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
            ,0x1ee);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    pthr._4_4_ = 0x32;
  }
  if (pthr._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pthr._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (HANDLE)0x0;
}

Assistant:

HANDLE
PALAPI
OpenEventW(
       IN DWORD dwDesiredAccess,
       IN BOOL bInheritHandle,
       IN LPCWSTR lpName)
{
    HANDLE hEvent = NULL;
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr = NULL;

    PERF_ENTRY(OpenEventW);
    ENTRY("OpenEventW(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%S))\n", 
          dwDesiredAccess, bInheritHandle, lpName, lpName?lpName:W16_NULLSTRING);

    pthr = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
        goto OpenEventWExit;            
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

OpenEventWExit:

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }

    LOGEXIT("OpenEventW returns HANDLE %p\n", hEvent);
    PERF_EXIT(OpenEventW);

    return hEvent;
}